

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O1

void initial_load_test_tailing_null(void)

{
  uint32_t uVar1;
  hbtrie_result hVar2;
  int iVar3;
  filemgr_ops *pfVar4;
  filemgr *pfVar5;
  bid_t bVar6;
  list_elem *plVar7;
  list_elem *plVar8;
  btree_blk_ops *pbVar9;
  initial_load_elem *ile;
  char *pcVar10;
  list_elem *plVar11;
  long lVar12;
  filemgr_open_result fVar13;
  docio_object dStack_1060;
  list lStack_1020;
  ulong uStack_1010;
  docio_handle dStack_1008;
  timeval tStack_fc8;
  btreeblk_handle bStack_fb8;
  hbtrie hStack_f40;
  char acStack_ed0 [9];
  undefined7 uStack_ec7;
  undefined1 uStack_ec0;
  char acStack_ebf [239];
  filemgr_config fStack_dd0;
  char acStack_d70 [256];
  char acStack_c70 [256];
  undefined1 auStack_b70 [256];
  undefined1 auStack_a70 [256];
  undefined1 auStack_970 [240];
  undefined8 uStack_880;
  docio_object local_828;
  list entries;
  uint8_t valuebuf [8];
  docio_handle dhandle;
  timeval __test_begin;
  btreeblk_handle bhandle;
  hbtrie trie;
  undefined8 local_698;
  undefined1 local_690;
  undefined1 local_68f [247];
  filemgr_config config;
  char body [256];
  char meta [256];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  local_828.timestamp = 0;
  local_828._20_4_ = 0;
  local_828.field_3.seqnum = 0;
  local_828.length.keylen = 0;
  local_828.length.metalen = 0;
  local_828.length.bodylen = 0;
  local_828.length.bodylen_ondisk = 0;
  local_828.length.flag = '\0';
  local_828.length.checksum = '\0';
  local_828.length.reserved = 0;
  local_828.key = keybuf;
  local_828.meta = metabuf;
  local_828.body = bodybuf;
  config.prefetch_duration = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.blocksize = 0x1000;
  config.ncacheblock = 0;
  config.flag = 0;
  config.chunksize = 8;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  pfVar4 = get_filemgr_ops();
  fVar13 = filemgr_open("./hbtrie_testfile",pfVar4,&config,(err_log_callback *)0x0);
  pfVar5 = fVar13.file;
  docio_init(&dhandle,pfVar5,false);
  btreeblk_init(&bhandle,pfVar5,0x1000);
  memset(local_68f,0,0xf7);
  local_698 = 0x3030303030303030;
  local_690 = 0;
  entries.head = (list_elem *)0x0;
  entries.tail = (list_elem *)0x0;
  lVar12 = 0;
  do {
    sprintf(meta,"metadata_%03zu",lVar12);
    sprintf(body,"body_%03zu",lVar12);
    uVar1 = _set_doc_bin(&local_828,(char *)&local_698,lVar12 + 8,meta,body);
    if (uVar1 == 0) {
      initial_load_test_tailing_null();
      goto LAB_0010961c;
    }
    bVar6 = docio_append_doc(&dhandle,&local_828,'\0','\0');
    plVar7 = (list_elem *)malloc(0x28);
    plVar11 = (list_elem *)(local_828.length._0_8_ & 0xffff);
    plVar7[1].next = plVar11;
    plVar8 = (list_elem *)malloc((size_t)plVar11);
    plVar7[1].prev = plVar8;
    memcpy(plVar8,&local_698,(size_t)plVar11);
    plVar7[2].prev =
         (list_elem *)
         (bVar6 >> 0x38 | (bVar6 & 0xff000000000000) >> 0x28 | (bVar6 & 0xff0000000000) >> 0x18 |
          (bVar6 & 0xff00000000) >> 8 | (bVar6 & 0xff000000) << 8 | (bVar6 & 0xff0000) << 0x18 |
          (bVar6 & 0xff00) << 0x28 | bVar6 << 0x38);
    list_push_back(&entries,plVar7);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  pbVar9 = btreeblk_get_ops();
  uStack_880 = 0x10942b;
  hbtrie_init_and_load
            (&trie,8,8,0x1000,0xffffffffffffffff,&bhandle,pbVar9,&dhandle,_readkey_wrap,8,
             initial_load_next,initial_load_get,initial_btreeblk_end,&entries);
  filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
  printf("trie root bid %lu\n",trie.root_bid);
  lVar12 = 0;
  while( true ) {
    sprintf(meta,"metadata_%03zu",lVar12);
    sprintf(body,"body_%03zu",lVar12);
    hVar2 = hbtrie_find(&trie,&local_698,(int)lVar12 + 8,valuebuf);
    btreeblk_end(&bhandle);
    if (hVar2 == HBTRIE_RESULT_FAIL) break;
    docio_read_doc(&dhandle,(ulong)valuebuf >> 0x38 | ((ulong)valuebuf & 0xff000000000000) >> 0x28 |
                            ((ulong)valuebuf & 0xff0000000000) >> 0x18 |
                            ((ulong)valuebuf & 0xff00000000) >> 8 |
                            ((ulong)valuebuf & 0xff000000) << 8 |
                            ((ulong)valuebuf & 0xff0000) << 0x18 |
                            ((ulong)valuebuf & 0xff00) << 0x28 | (long)valuebuf << 0x38,&local_828,
                   true);
    iVar3 = bcmp(local_828.key,&local_698,local_828.length._0_8_ & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_tailing_null();
    }
    iVar3 = bcmp(local_828.meta,meta,(ulong)local_828.length._0_8_ >> 0x10 & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_tailing_null();
    }
    iVar3 = bcmp(local_828.body,body,(ulong)local_828.length._0_8_ >> 0x20);
    if (iVar3 != 0) {
      initial_load_test_tailing_null();
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      hbtrie_free(&trie);
      docio_free(&dhandle);
      btreeblk_free(&bhandle);
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      plVar7 = entries.head;
      while (plVar7 != (list_elem *)0x0) {
        plVar8 = plVar7->next;
        free(plVar7[1].prev);
        free(plVar7);
        plVar7 = plVar8;
      }
      pcVar10 = "%s PASSED\n";
      if (initial_load_test_tailing_null()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar10,"initial load with tailing null test");
      return;
    }
  }
LAB_0010961c:
  initial_load_test_tailing_null();
  gettimeofday(&tStack_fc8,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  dStack_1060.timestamp = 0;
  dStack_1060._20_4_ = 0;
  dStack_1060.field_3.seqnum = 0;
  dStack_1060.length.keylen = 0;
  dStack_1060.length.metalen = 0;
  dStack_1060.length.bodylen = 0;
  dStack_1060.length.bodylen_ondisk = 0;
  dStack_1060.length.flag = '\0';
  dStack_1060.length.checksum = '\0';
  dStack_1060.length.reserved = 0;
  dStack_1060.key = auStack_970;
  dStack_1060.meta = auStack_a70;
  dStack_1060.body = auStack_b70;
  fStack_dd0.prefetch_duration = 0;
  fStack_dd0.encryption_key.bytes[0] = '\0';
  fStack_dd0.encryption_key.bytes[1] = '\0';
  fStack_dd0.encryption_key.bytes[2] = '\0';
  fStack_dd0.encryption_key.bytes[3] = '\0';
  fStack_dd0.encryption_key.bytes[4] = '\0';
  fStack_dd0.encryption_key.bytes[5] = '\0';
  fStack_dd0.encryption_key.bytes[6] = '\0';
  fStack_dd0.encryption_key.bytes[7] = '\0';
  fStack_dd0.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_dd0.do_not_cache_doc_blocks = false;
  fStack_dd0._89_3_ = 0;
  fStack_dd0.num_blocks_readahead = 0;
  fStack_dd0.encryption_key.bytes[0x18] = '\0';
  fStack_dd0.encryption_key.bytes[0x19] = '\0';
  fStack_dd0.encryption_key.bytes[0x1a] = '\0';
  fStack_dd0.encryption_key.bytes[0x1b] = '\0';
  fStack_dd0.encryption_key.bytes[0x1c] = '\0';
  fStack_dd0.encryption_key.bytes[0x1d] = '\0';
  fStack_dd0.encryption_key.bytes[0x1e] = '\0';
  fStack_dd0.encryption_key.bytes[0x1f] = '\0';
  fStack_dd0.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_dd0.encryption_key.bytes[8] = '\0';
  fStack_dd0.encryption_key.bytes[9] = '\0';
  fStack_dd0.encryption_key.bytes[10] = '\0';
  fStack_dd0.encryption_key.bytes[0xb] = '\0';
  fStack_dd0.encryption_key.bytes[0xc] = '\0';
  fStack_dd0.encryption_key.bytes[0xd] = '\0';
  fStack_dd0.encryption_key.bytes[0xe] = '\0';
  fStack_dd0.encryption_key.bytes[0xf] = '\0';
  fStack_dd0.encryption_key.bytes[0x10] = '\0';
  fStack_dd0.encryption_key.bytes[0x11] = '\0';
  fStack_dd0.encryption_key.bytes[0x12] = '\0';
  fStack_dd0.encryption_key.bytes[0x13] = '\0';
  fStack_dd0.encryption_key.bytes[0x14] = '\0';
  fStack_dd0.encryption_key.bytes[0x15] = '\0';
  fStack_dd0.encryption_key.bytes[0x16] = '\0';
  fStack_dd0.encryption_key.bytes[0x17] = '\0';
  fStack_dd0.blocksize = 0x1000;
  fStack_dd0.ncacheblock = 0;
  fStack_dd0.flag = 0;
  fStack_dd0.chunksize = 8;
  fStack_dd0.options = '\b';
  fStack_dd0.seqtree_opt = '\0';
  fStack_dd0._18_6_ = 0;
  fStack_dd0.num_wal_shards = 8;
  fStack_dd0.num_bcache_shards = 0;
  fStack_dd0.encryption_key.algorithm = 0;
  pfVar4 = get_filemgr_ops();
  fVar13 = filemgr_open("./hbtrie_testfile",pfVar4,&fStack_dd0,(err_log_callback *)0x0);
  pfVar5 = fVar13.file;
  docio_init(&dStack_1008,pfVar5,false);
  btreeblk_init(&bStack_fb8,pfVar5,0x1000);
  memset(acStack_ebf + 8,0,0xe7);
  builtin_strncpy(acStack_ed0,"00000000a",9);
  uStack_ec7 = 0x61616161616161;
  uStack_ec0 = 0x62;
  builtin_strncpy(acStack_ebf,"bbbbbbb",8);
  lStack_1020.head = (list_elem *)0x0;
  lStack_1020.tail = (list_elem *)0x0;
  lVar12 = 0;
  do {
    sprintf(acStack_c70,"metadata_%03zu",lVar12);
    sprintf(acStack_d70,"body_%03zu",lVar12);
    uVar1 = _set_doc_bin(&dStack_1060,acStack_ed0,lVar12 + 0x10,acStack_c70,acStack_d70);
    if (uVar1 == 0) {
      initial_load_test_incremental_prefix();
      goto LAB_00109a73;
    }
    bVar6 = docio_append_doc(&dStack_1008,&dStack_1060,'\0','\0');
    plVar7 = (list_elem *)malloc(0x28);
    plVar11 = (list_elem *)(dStack_1060.length._0_8_ & 0xffff);
    plVar7[1].next = plVar11;
    plVar8 = (list_elem *)malloc((size_t)plVar11);
    plVar7[1].prev = plVar8;
    memcpy(plVar8,acStack_ed0,(size_t)plVar11);
    plVar7[2].prev =
         (list_elem *)
         (bVar6 >> 0x38 | (bVar6 & 0xff000000000000) >> 0x28 | (bVar6 & 0xff0000000000) >> 0x18 |
          (bVar6 & 0xff00000000) >> 8 | (bVar6 & 0xff000000) << 8 | (bVar6 & 0xff0000) << 0x18 |
          (bVar6 & 0xff00) << 0x28 | bVar6 << 0x38);
    list_push_back(&lStack_1020,plVar7);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  pbVar9 = btreeblk_get_ops();
  hbtrie_init_and_load
            (&hStack_f40,8,8,0x1000,0xffffffffffffffff,&bStack_fb8,pbVar9,&dStack_1008,_readkey_wrap
             ,8,initial_load_next,initial_load_get,initial_btreeblk_end,&lStack_1020);
  filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
  printf("trie root bid %lu\n",hStack_f40.root_bid);
  lVar12 = 0;
  while( true ) {
    sprintf(acStack_c70,"metadata_%03zu",lVar12);
    sprintf(acStack_d70,"body_%03zu",lVar12);
    hVar2 = hbtrie_find(&hStack_f40,acStack_ed0,(int)lVar12 + 0x10,&uStack_1010);
    btreeblk_end(&bStack_fb8);
    if (hVar2 == HBTRIE_RESULT_FAIL) break;
    docio_read_doc(&dStack_1008,
                   uStack_1010 >> 0x38 | (uStack_1010 & 0xff000000000000) >> 0x28 |
                   (uStack_1010 & 0xff0000000000) >> 0x18 | (uStack_1010 & 0xff00000000) >> 8 |
                   (uStack_1010 & 0xff000000) << 8 | (uStack_1010 & 0xff0000) << 0x18 |
                   (uStack_1010 & 0xff00) << 0x28 | uStack_1010 << 0x38,&dStack_1060,true);
    iVar3 = bcmp(dStack_1060.key,acStack_ed0,dStack_1060.length._0_8_ & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_incremental_prefix();
    }
    iVar3 = bcmp(dStack_1060.meta,acStack_c70,(ulong)dStack_1060.length._0_8_ >> 0x10 & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_incremental_prefix();
    }
    iVar3 = bcmp(dStack_1060.body,acStack_d70,(ulong)dStack_1060.length._0_8_ >> 0x20);
    if (iVar3 != 0) {
      initial_load_test_incremental_prefix();
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      hbtrie_free(&hStack_f40);
      docio_free(&dStack_1008);
      btreeblk_free(&bStack_fb8);
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      plVar7 = lStack_1020.head;
      while (plVar7 != (list_elem *)0x0) {
        plVar8 = plVar7->next;
        free(plVar7[1].prev);
        free(plVar7);
        plVar7 = plVar8;
      }
      pcVar10 = "%s PASSED\n";
      if (initial_load_test_incremental_prefix()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar10,"initial load with tailing null test");
      return;
    }
  }
LAB_00109a73:
  initial_load_test_incremental_prefix();
  basic_test();
  skew_basic_test();
  hbtrie_reverse_iterator_test();
  hbtrie_partial_update_test();
  iterator_start_key_greater_than_prefix_test();
  initial_load_test_single_common_prefix();
  initial_load_test_nested_common_prefix();
  initial_load_test_tailing_null();
  initial_load_test_incremental_prefix();
  return;
}

Assistant:

void initial_load_test_tailing_null()
{
    TEST_INIT();

    int blocksize = 4096;
    uint64_t offset, _offset;
    uint32_t docsize;
    char dockey[256], meta[256], body[256];
    hbtrie_result r;

    int rr = system(SHELL_DEL " hbtrie_testfile");
    (void)rr;

    char keybuf[256], metabuf[256], bodybuf[256];
    struct docio_object doc;
    memset(&doc, 0, sizeof(struct docio_object));
    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    struct filemgr_config config;
    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    struct filemgr *file = result.file;
    struct docio_handle dhandle;
    docio_init(&dhandle, file, false);

    struct btreeblk_handle bhandle;
    btreeblk_init(&bhandle, file, blocksize);

    memset(dockey, 0x0, 256);
    sprintf(dockey, "00000000");

    struct list entries;
    list_init(&entries);
    for (size_t ii = 0; ii < 8; ++ii) {
        sprintf(meta, "metadata_%03zu", ii);
        sprintf(body, "body_%03zu", ii);
        docsize = _set_doc_bin(&doc, dockey, 8 + ii, meta, body);
        TEST_CHK(docsize != 0);
        offset = docio_append_doc(&dhandle, &doc, 0, 0);
        _offset = _endian_encode(offset);

        struct initial_load_elem* ile =
            (struct initial_load_elem*)malloc(sizeof(struct initial_load_elem));
        ile->keylen = doc.length.keylen;
        ile->key = (uint8_t*)malloc(ile->keylen);
        memcpy(ile->key, dockey, ile->keylen);
        memcpy(ile->value, &_offset, sizeof(_offset));
        list_push_back(&entries, &ile->le);
    }

    struct hbtrie trie;
    hbtrie_init_and_load(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
                         (void*)&bhandle, btreeblk_get_ops(),
                         (void*)&dhandle, _readkey_wrap,
                         8,
                         initial_load_next, initial_load_get, initial_btreeblk_end,
                         &entries);

    filemgr_commit(file, true, NULL);
    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    for (size_t ii = 0; ii < 8; ++ii) {
        sprintf(meta, "metadata_%03zu", ii);
        sprintf(body, "body_%03zu", ii);

        uint8_t valuebuf[8];
        r = hbtrie_find(&trie, (void*)dockey, 8 + ii, (void*)valuebuf);
        btreeblk_end(&bhandle);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);

        if (r != HBTRIE_RESULT_FAIL) {
            memcpy(&_offset, valuebuf, 8);
            _offset = _endian_decode(_offset);
            docio_read_doc(&dhandle, _offset, &doc, true);

            TEST_CHK(!memcmp(doc.key, dockey, doc.length.keylen));
            TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
            TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));
        }
    }

    hbtrie_free(&trie);
    docio_free(&dhandle);
    btreeblk_free(&bhandle);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    struct list_elem* le = list_begin(&entries);
    while (le) {
        struct initial_load_elem* ile =
            _get_entry(le, struct initial_load_elem, le);
        le = list_next(le);
        free(ile->key);
        free(ile);
    }

    TEST_RESULT("initial load with tailing null test");
}